

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O1

polynomial * __thiscall
polynomial::operator*(polynomial *__return_storage_ptr__,polynomial *this,polynomial *other)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar1;
  pointer puVar2;
  uint64_t b;
  uint64_t uVar3;
  ulong uVar4;
  int j;
  long lVar5;
  long lVar6;
  allocator_type local_51;
  size_type local_50;
  long local_48;
  polynomial *local_40;
  polynomial *local_38;
  
  puVar1 = (this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = (long)puVar1 - (long)puVar2 >> 3;
  __return_storage_ptr__->n = this->n;
  this_00 = &__return_storage_ptr__->p;
  local_40 = __return_storage_ptr__;
  local_38 = other;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_00,local_50,&local_51);
  if (puVar1 != puVar2) {
    local_48 = local_50 + (local_50 == 0);
    lVar6 = 0;
    do {
      lVar5 = 0;
      do {
        uVar4 = (ulong)(lVar6 + lVar5) % local_50;
        uVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[uVar4];
        b = gaIMulMod((this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar6],
                      (local_38->p).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5],this->n);
        uVar3 = gaIAddMod(uVar3,b,this->n);
        (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar4] = uVar3;
        lVar5 = lVar5 + 1;
      } while (local_48 != lVar5);
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_48);
  }
  return local_40;
}

Assistant:

polynomial operator* (const polynomial& other) {
        uint64_t r = this->p.size();
        polynomial ret(r, n);
        for (int i = 0; i < r; i++) {
            for (int j = 0; j < r; j++) {
                 ret.p[(i+j) % r] = gaIAddMod(ret.p[(i+j) % r], gaIMulMod(this->p[i], other.p[j], this->n), this->n);
            }
        }
        return ret;
    }